

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

vector<duckdb::Value,_true> * __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::Value,true>>
          (vector<duckdb::Value,_true> *__return_storage_ptr__,Deserializer *this,
          field_id_t field_id,char *tag)

{
  int iVar1;
  undefined4 extraout_var;
  undefined6 in_register_00000012;
  long lVar2;
  Value val;
  Value local_68;
  
  iVar1 = (*this->_vptr_Deserializer[4])
                    (this,CONCAT62(in_register_00000012,field_id) & 0xffffffff,tag);
  if ((char)iVar1 == '\0') {
    (*this->_vptr_Deserializer[5])(this,0);
    (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68.type_.id_ = INVALID;
    local_68.type_.physical_type_ = ~INVALID;
    local_68.type_._2_6_ = 0;
    local_68.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_68);
  }
  else {
    (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar1 = (*this->_vptr_Deserializer[8])(this);
    for (lVar2 = CONCAT44(extraout_var,iVar1); lVar2 != 0; lVar2 = lVar2 + -1) {
      (*this->_vptr_Deserializer[6])(this);
      Value::Deserialize(&local_68,this);
      (*this->_vptr_Deserializer[7])(this);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)__return_storage_ptr__,
                 &local_68);
      Value::~Value(&local_68);
    }
    (*this->_vptr_Deserializer[9])(this);
    (*this->_vptr_Deserializer[5])(this,1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline T ReadPropertyWithDefault(const field_id_t field_id, const char *tag) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(SerializationDefaultValue::GetDefault<T>());
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}